

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O0

int __thiscall
ActionConstbase::clone
          (ActionConstbase *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  string *psVar2;
  ActionGroupList *grouplist_local;
  ActionConstbase *this_local;
  
  psVar2 = Action::getGroup_abi_cxx11_(&this->super_Action);
  bVar1 = ActionGroupList::contains((ActionGroupList *)__fn,psVar2);
  if (bVar1) {
    this_local = (ActionConstbase *)operator_new(0x68);
    psVar2 = Action::getGroup_abi_cxx11_(&this->super_Action);
    ActionConstbase(this_local,psVar2);
  }
  else {
    this_local = (ActionConstbase *)0x0;
  }
  return (int)this_local;
}

Assistant:

virtual Action *clone(const ActionGroupList &grouplist) const {
    if (!grouplist.contains(getGroup())) return (Action *)0;
    return new ActionConstbase(getGroup());
  }